

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_reverse.c
# Opt level: O0

int reverse(int x)

{
  bsp_pid_t bVar1;
  bsp_pid_t bVar2;
  int local_c [2];
  int x_local;
  
  local_c[0] = x;
  bsp_push_reg(local_c,4);
  bsp_sync();
  bVar1 = bsp_nprocs();
  bVar2 = bsp_pid();
  bsp_put((bVar1 - bVar2) + -1,local_c,local_c,0,4);
  bsp_pop_reg(local_c);
  bsp_sync();
  return local_c[0];
}

Assistant:

int reverse( int x )
{
    bsp_push_reg( &x, sizeof(x) );
    bsp_sync();

    bsp_put( bsp_nprocs() - bsp_pid() - 1, &x, &x, 0, sizeof(x) );
    bsp_pop_reg(&x);
    bsp_sync();
    return x;
}